

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O2

string * __thiscall
Token::get_typename_abi_cxx11_(string *__return_storage_ptr__,Token *this,int type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar2 = anon_var_dwarf_1bdc3;
    paVar1 = &local_9;
    break;
  case 2:
    pcVar2 = anon_var_dwarf_1bdd9;
    paVar1 = &local_a;
    break;
  case 3:
    pcVar2 = anon_var_dwarf_1bde3;
    paVar1 = &local_b;
    break;
  case 4:
    pcVar2 = anon_var_dwarf_1bdf9;
    paVar1 = &local_c;
    break;
  case 5:
    pcVar2 = anon_var_dwarf_1be0f;
    paVar1 = &local_d;
    break;
  case 6:
    pcVar2 = anon_var_dwarf_1be25;
    paVar1 = &local_e;
    break;
  case 7:
    pcVar2 = anon_var_dwarf_1be3b;
    paVar1 = &local_f;
    break;
  case 8:
    pcVar2 = anon_var_dwarf_1be51;
    paVar1 = &local_10;
    break;
  default:
    pcVar2 = anon_var_dwarf_1be5b;
    paVar1 = &local_11;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::get_typename(int type) {
    switch (type) {
        case KEY_WORD:
            return "(关键字)keyword";
        case OPERATOR:
            return "(操作符)operator";
        case DELIMITERS:
            return "(分隔符)delimiter";
        case IDENTIFIER:
            return "(标识符)id";
        case NUMBER:
            return "(数字)  number";
        case STRING:
            return "(字符串)string";
        case CHAR:
            return "(字符)  char";
        case ANNOTATION:
            return "(注解)  annotation";
        default:
            return "(未知)  unknown";
    }
}